

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_embedded_file.cpp
# Opt level: O3

ON_EmbeddedFile *
ON_EmbeddedFile::FromModelComponentRef
          (ON_ModelComponentReference *ref,ON_EmbeddedFile *none_return_value)

{
  bool bVar1;
  ON_EmbeddedFile *this;
  ON_EmbeddedFile *pOVar2;
  
  this = (ON_EmbeddedFile *)ON_ModelComponentReference::ModelComponent(ref);
  if (this == (ON_EmbeddedFile *)0x0) {
    pOVar2 = (ON_EmbeddedFile *)0x0;
  }
  else {
    bVar1 = ON_Object::IsKindOf((ON_Object *)this,&m_ON_EmbeddedFile_class_rtti);
    pOVar2 = (ON_EmbeddedFile *)0x0;
    if (bVar1) {
      pOVar2 = this;
    }
  }
  if (pOVar2 != (ON_EmbeddedFile *)0x0) {
    none_return_value = pOVar2;
  }
  return none_return_value;
}

Assistant:

const ON_EmbeddedFile* ON_EmbeddedFile::FromModelComponentRef(const ON_ModelComponentReference& ref,
                                                              const ON_EmbeddedFile* none_return_value) // Static.
{
  const auto* ef = ON_EmbeddedFile::Cast(ref.ModelComponent());
  if (nullptr != ef)
    return ef;

  return none_return_value;
}